

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec_random.cpp
# Opt level: O0

result_type_conflict __thiscall SecRandom::operator()(SecRandom *this)

{
  ssize_t sVar1;
  int *piVar2;
  ssize_t s;
  char *p;
  size_t n;
  SecRandom *pSStack_10;
  result_type_conflict r;
  SecRandom *this_local;
  
  p = (char *)0x1;
  s = (long)&n + 7;
  pSStack_10 = this;
  while (p != (char *)0x0) {
    sVar1 = read(this->fd_,(void *)s,(size_t)p);
    if (sVar1 == 0) {
      anon_unknown.dwarf_31fd::__throw_system_error(0x3d,"random_device got EOF");
    }
    if (sVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 4) {
        piVar2 = __errno_location();
        anon_unknown.dwarf_31fd::__throw_system_error
                  (*piVar2,"random_device got an unexpected error");
      }
    }
    else {
      p = p + -sVar1;
      s = sVar1 + s;
    }
  }
  return n._7_1_;
}

Assistant:

SecRandom::result_type SecRandom::operator()()
{
  result_type r;
  size_t n = sizeof(r);
  char* p = reinterpret_cast<char*>(&r);
  while (n > 0)
  {
    ssize_t s = read(fd_, p, n);
    if (s == 0)
      __throw_system_error(ENODATA, "random_device got EOF");
    if (s == -1) 
    {   
      if (errno != EINTR)
        __throw_system_error(errno, "random_device got an unexpected error");
      continue;
    }   
    n -= static_cast<size_t>(s);
    p += static_cast<size_t>(s);
  }
  return r;
}